

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataType.cpp
# Opt level: O0

vector<long,_std::allocator<long>_> *
CoreML::defaultShapeOf
          (vector<long,_std::allocator<long>_> *__return_storage_ptr__,ArrayFeatureType *params)

{
  int iVar1;
  int iVar2;
  ShapeFlexibilityCase SVar3;
  ArrayFeatureType_EnumeratedShapes *pAVar4;
  ArrayFeatureType_Shape *pAVar5;
  ArrayFeatureType_ShapeRange *pAVar6;
  SizeRange *this;
  uint64 local_58;
  int local_4c;
  int64 iStack_48;
  int i_2;
  int local_40;
  int i_1;
  int local_30;
  int i;
  undefined1 local_19;
  ArrayFeatureType *local_18;
  ArrayFeatureType *params_local;
  vector<long,_std::allocator<long>_> *defaultShape;
  
  local_19 = 0;
  local_18 = params;
  params_local = (ArrayFeatureType *)__return_storage_ptr__;
  std::vector<long,_std::allocator<long>_>::vector(__return_storage_ptr__);
  iVar1 = Specification::ArrayFeatureType::shape_size(local_18);
  if (iVar1 < 1) {
    SVar3 = Specification::ArrayFeatureType::ShapeFlexibility_case(local_18);
    if (SVar3 != SHAPEFLEXIBILITY_NOT_SET) {
      if (SVar3 == kEnumeratedShapes) {
        local_40 = 0;
        while( true ) {
          iVar1 = local_40;
          pAVar4 = Specification::ArrayFeatureType::enumeratedshapes(local_18);
          pAVar5 = Specification::ArrayFeatureType_EnumeratedShapes::shapes(pAVar4,0);
          iVar2 = Specification::ArrayFeatureType_Shape::shape_size(pAVar5);
          if (iVar2 <= iVar1) break;
          pAVar4 = Specification::ArrayFeatureType::enumeratedshapes(local_18);
          pAVar5 = Specification::ArrayFeatureType_EnumeratedShapes::shapes(pAVar4,0);
          iStack_48 = Specification::ArrayFeatureType_Shape::shape(pAVar5,local_40);
          std::vector<long,_std::allocator<long>_>::push_back
                    (__return_storage_ptr__,&stack0xffffffffffffffb8);
          local_40 = local_40 + 1;
        }
      }
      else if (SVar3 == kShapeRange) {
        local_4c = 0;
        while( true ) {
          iVar1 = local_4c;
          pAVar6 = Specification::ArrayFeatureType::shaperange(local_18);
          iVar2 = Specification::ArrayFeatureType_ShapeRange::sizeranges_size(pAVar6);
          if (iVar2 <= iVar1) break;
          pAVar6 = Specification::ArrayFeatureType::shaperange(local_18);
          this = Specification::ArrayFeatureType_ShapeRange::sizeranges(pAVar6,local_4c);
          local_58 = Specification::SizeRange::lowerbound(this);
          std::vector<long,_std::allocator<long>_>::push_back
                    (__return_storage_ptr__,(value_type_conflict *)&local_58);
          local_4c = local_4c + 1;
        }
      }
    }
  }
  else {
    for (local_30 = 0; iVar1 = local_30,
        iVar2 = Specification::ArrayFeatureType::shape_size(local_18), iVar1 < iVar2;
        local_30 = local_30 + 1) {
      _i_1 = Specification::ArrayFeatureType::shape(local_18,local_30);
      std::vector<long,_std::allocator<long>_>::push_back
                (__return_storage_ptr__,(value_type_conflict *)&i_1);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

static std::vector<int64_t> defaultShapeOf(const Specification::ArrayFeatureType &params) {
        std::vector<int64_t> defaultShape;
        if (params.shape_size() > 0) {
            for (int i = 0; i<params.shape_size(); i++) {
                defaultShape.push_back((int64_t)params.shape(i));
            }
            return defaultShape;
        }

        switch (params.ShapeFlexibility_case()) {
            case Specification::ArrayFeatureType::kEnumeratedShapes: {
                for (int i = 0; i < params.enumeratedshapes().shapes(0).shape_size(); i++) {
                    defaultShape.push_back((int64_t)params.enumeratedshapes().shapes(0).shape(i));
                }
                break;
            }
            case Specification::ArrayFeatureType::kShapeRange: {
                for (int i=0; i < params.shaperange().sizeranges_size(); i++) {
                    defaultShape.push_back((int64_t)params.shaperange().sizeranges(i).lowerbound());
                }
                break;
            }
            case Specification::ArrayFeatureType::SHAPEFLEXIBILITY_NOT_SET:
                break;
        }

        return defaultShape;
    }